

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

bool __thiscall
slang::ast::ConstraintExprVisitor::checkType(ConstraintExprVisitor *this,Expression *expr)

{
  bool bVar1;
  Diagnostic *diag;
  
  bVar1 = Type::isValidForRand
                    ((expr->type).ptr,Rand,
                     (((this->context->scope).ptr)->compilation->options).languageVersion);
  if (!bVar1) {
    diag = ASTContext::addDiag(this->context,(DiagCode)0x210008,expr->sourceRange);
    ast::operator<<(diag,(expr->type).ptr);
  }
  return bVar1;
}

Assistant:

bool checkType(const Expression& expr) {
        if (!expr.type->isValidForRand(RandMode::Rand,
                                       context.getCompilation().languageVersion())) {
            context.addDiag(diag::InvalidConstraintExpr, expr.sourceRange) << *expr.type;
            return false;
        }
        return true;
    }